

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O1

bool __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::isEmptyValue(CapnpcCapnpMain *this,Reader value)

{
  undefined2 uVar1;
  PointerType PVar2;
  bool bVar3;
  PointerReader local_28;
  
  if (value._reader.dataSize < 0x10) {
    uVar1 = 0;
  }
  else {
    uVar1 = *value._reader.data;
  }
  bVar3 = true;
  switch(uVar1) {
  case 1:
    if (0x10 < value._reader.dataSize) {
      bVar3 = (*(byte *)((long)value._reader.data + 2) & 1) == 0;
    }
    break;
  case 2:
  case 6:
    if (0x17 < value._reader.dataSize) {
      bVar3 = *(char *)((long)value._reader.data + 2) == '\0';
    }
    break;
  case 3:
  case 7:
  case 0xf:
    if (0x1f < value._reader.dataSize) {
      bVar3 = *(short *)((long)value._reader.data + 2) == 0;
    }
    break;
  case 4:
  case 8:
    if (0x3f < value._reader.dataSize) {
      bVar3 = *(int *)((long)value._reader.data + 4) == 0;
    }
    break;
  case 5:
  case 9:
    if (0x7f < value._reader.dataSize) {
      bVar3 = *(long *)((long)value._reader.data + 8) == 0;
    }
    break;
  case 10:
    if (value._reader.dataSize < 0x40) {
      return true;
    }
    bVar3 = *(float *)((long)value._reader.data + 4) == 0.0;
    goto LAB_00143288;
  case 0xb:
    if (value._reader.dataSize < 0x80) {
      return true;
    }
    bVar3 = *(double *)((long)value._reader.data + 8) == 0.0;
LAB_00143288:
    bVar3 = (bool)(-bVar3 & 1);
    break;
  case 0xc:
    if (value._reader.dataSize < 0x10) {
      return true;
    }
    if (*value._reader.data != 0xc) {
      return true;
    }
    goto LAB_00143252;
  case 0xd:
    if (value._reader.dataSize < 0x10) {
      return true;
    }
    if (*value._reader.data != 0xd) {
      return true;
    }
    goto LAB_00143252;
  case 0xe:
    if (value._reader.dataSize < 0x10) {
      return true;
    }
    if (*value._reader.data != 0xe) {
      return true;
    }
    goto LAB_00143252;
  case 0x10:
    if (value._reader.dataSize < 0x10) {
      return true;
    }
    if (*value._reader.data != 0x10) {
      return true;
    }
LAB_00143252:
    if (value._reader.pointerCount == 0) {
      local_28.segment = (SegmentReader *)0x0;
      local_28.capTable = (CapTableReader *)0x0;
      local_28.pointer = (WirePointer *)0x0;
      local_28.nestingLimit = 0x7fffffff;
    }
    else {
      local_28.segment = value._reader.segment;
      local_28.capTable = value._reader.capTable;
      local_28.pointer = value._reader.pointers;
      local_28.nestingLimit = value._reader.nestingLimit;
    }
    PVar2 = _::PointerReader::getPointerType(&local_28);
    bVar3 = PVar2 == NULL_;
  }
  return bVar3;
}

Assistant:

bool isEmptyValue(schema::Value::Reader value) {
    switch (value.which()) {
      case schema::Value::VOID: return true;
      case schema::Value::BOOL: return value.getBool() == false;
      case schema::Value::INT8: return value.getInt8() == 0;
      case schema::Value::INT16: return value.getInt16() == 0;
      case schema::Value::INT32: return value.getInt32() == 0;
      case schema::Value::INT64: return value.getInt64() == 0;
      case schema::Value::UINT8: return value.getUint8() == 0;
      case schema::Value::UINT16: return value.getUint16() == 0;
      case schema::Value::UINT32: return value.getUint32() == 0;
      case schema::Value::UINT64: return value.getUint64() == 0;
      case schema::Value::FLOAT32: return value.getFloat32() == 0;
      case schema::Value::FLOAT64: return value.getFloat64() == 0;
      case schema::Value::TEXT: return !value.hasText();
      case schema::Value::DATA: return !value.hasData();
      case schema::Value::LIST: return !value.hasList();
      case schema::Value::ENUM: return value.getEnum() == 0;
      case schema::Value::STRUCT: return !value.hasStruct();
      case schema::Value::INTERFACE: return true;
      case schema::Value::ANY_POINTER: return true;
    }
    return true;
  }